

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O3

int MPIABI_File_read_at_all_begin
              (MPIABI_File fh,MPIABI_Offset offset,void *buf,int count,MPIABI_Datatype datatype)

{
  int iVar1;
  
  iVar1 = MPI_File_read_at_all_begin();
  return iVar1;
}

Assistant:

int MPIABI_File_read_at_all_begin(
  MPIABI_File fh,
  MPIABI_Offset offset,
  void * buf,
  int count,
  MPIABI_Datatype datatype
) {
  return MPI_File_read_at_all_begin(
    (MPI_File)(WPI_File)fh,
    (MPI_Offset)(WPI_Offset)offset,
    buf,
    count,
    (MPI_Datatype)(WPI_Datatype)datatype
  );
}